

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::SourceRange>::
emplaceRealloc<slang::SourceLocation&,slang::SourceLocation&>
          (SmallVectorBase<slang::SourceRange> *this,pointer pos,SourceLocation *args,
          SourceLocation *args_1)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pSVar4;
  long lVar5;
  pointer pSVar6;
  iterator pSVar7;
  SourceLocation *in_RCX;
  SourceLocation *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::SourceRange> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  SourceRange *in_stack_ffffffffffffff80;
  SourceRange *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff90;
  iterator __first;
  SmallVectorBase<slang::SourceRange> *in_stack_ffffffffffffff98;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::SourceRange> *)0xb38679);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  __first = in_RSI;
  pSVar4 = begin(in_RDI);
  lVar5 = (long)__first - (long)pSVar4;
  pSVar6 = (pointer)operator_new(0xb386d8);
  SourceRange::SourceRange(pSVar6 + (lVar5 >> 4),*in_RDX,*in_RCX);
  pSVar4 = in_RSI;
  pSVar7 = end(in_RDI);
  if (pSVar4 == pSVar7) {
    pSVar7 = begin(in_RDI);
    pSVar4 = end(in_RDI);
    std::uninitialized_move<slang::SourceRange*,slang::SourceRange*>
              (__first,pSVar7,in_stack_ffffffffffffff80);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<slang::SourceRange*,slang::SourceRange*>
              (__first,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    pSVar4 = end(in_RDI);
    std::uninitialized_move<slang::SourceRange*,slang::SourceRange*>
              (__first,in_stack_ffffffffffffff88,in_RSI);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pSVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pSVar6;
  return pSVar6 + (lVar5 >> 4);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}